

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcRootLogLikelihoodsPerCategory
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int stateFrequenciesIndex,
          int scalingFactorsIndex,double *outLogLikelihoodPerCategory)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  double dVar11;
  undefined1 auVar12 [16];
  
  iVar10 = 0;
  lVar8 = 0;
  pfVar2 = this->gStateFrequencies[stateFrequenciesIndex];
  pfVar3 = this->gPartials[bufferIndex];
  for (iVar5 = 0; uVar4 = this->kCategoryCount, iVar5 < (int)uVar4; iVar5 = iVar5 + 1) {
    lVar8 = (long)(int)lVar8;
    for (iVar7 = 0; iVar7 < this->kPatternCount; iVar7 = iVar7 + 1) {
      auVar12 = ZEXT816(0) << 0x40;
      uVar4 = ~(this->kStateCount >> 0x1f) & this->kStateCount;
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)pfVar3[(long)iVar10 + uVar6]),
                                  ZEXT416((uint)pfVar2[uVar6]));
      }
      iVar10 = iVar10 + uVar4;
      dVar11 = log((double)auVar12._0_4_);
      outLogLikelihoodPerCategory[lVar8] = dVar11;
      lVar8 = lVar8 + 1;
    }
  }
  if (-1 < scalingFactorsIndex) {
    uVar1 = this->kPatternCount;
    pfVar2 = this->gScaleBuffers[(uint)scalingFactorsIndex];
    lVar8 = 0;
    for (uVar9 = 0; uVar9 != (~((int)uVar4 >> 0x1f) & uVar4); uVar9 = uVar9 + 1) {
      lVar8 = (long)(int)lVar8;
      for (uVar6 = 0; (~((int)uVar1 >> 0x1f) & uVar1) != uVar6; uVar6 = uVar6 + 1) {
        outLogLikelihoodPerCategory[lVar8 + uVar6] =
             (double)pfVar2[uVar6] + outLogLikelihoodPerCategory[lVar8 + uVar6];
      }
      lVar8 = lVar8 + uVar6;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsPerCategory(
        const int bufferIndex,
        const int stateFrequenciesIndex,
        const int scalingFactorsIndex,
        double* outLogLikelihoodPerCategory) {

    int returnCode = BEAGLE_SUCCESS;

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    const REALTYPE* freqs = gStateFrequencies[stateFrequenciesIndex];

    int u = 0;
    int v = 0;
    for (int l = 0; l < kCategoryCount; l++) {
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += rootPartials[v] * freqs[i];
                v++;
            }
            outLogLikelihoodPerCategory[u] = log(sum);
            u++;
            v += P_PAD;
        }
    }

    if (scalingFactorsIndex >= 0) {
        const REALTYPE* cumulativeScaleFactors = gScaleBuffers[scalingFactorsIndex];
        int u = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                outLogLikelihoodPerCategory[u] += cumulativeScaleFactors[i];
                u++;
            }
        }
    }

    return returnCode;
}